

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O2

void test_100(QPDF *pdf,char *arg2)

{
  char cVar1;
  bool bVar2;
  unsigned_long uVar3;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *pvVar4;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *p_Var5;
  logic_error *plVar6;
  bool raw;
  bool raw_00;
  bool raw_01;
  bool raw_02;
  bool raw_03;
  bool raw_04;
  QPDFObjectHandle *metadata;
  QPDFObjectHandle *metadata_00;
  QPDFObjectHandle *metadata_01;
  QPDFObjectHandle *metadata_02;
  long lVar7;
  QPDFObjectHandle QVar8;
  QPDFObjectHandle QVar9;
  allocator<char> local_121;
  QPDF updated;
  QPDFObjectHandle page_metadata;
  QPDFObjectHandle copied_root;
  string raw_bytes;
  QPDFObjectHandle o;
  QPDFObjectHandle root_metadata;
  QPDFObjectHandle root;
  QPDFWriter w;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a0;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_98;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_88;
  QPDFObjectHandle copied_page;
  value_type page;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  QPDFWriter::QPDFWriter(&w,pdf,"a.pdf");
  QPDFWriter::setR6EncryptionParameters
            ((char *)&w,"",true,true,true,true,true,true,qpdf_r3p_low,false);
  QPDFWriter::write();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0);
  QPDF::QPDF(&updated);
  QPDF::processFile((char *)&updated,"a.pdf");
  QUtil::read_file_into_string_abi_cxx11_((char *)&w);
  QPDF::getRoot();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&raw_bytes,"/Metadata",(allocator<char> *)&page);
  QPDFObjectHandle::getKey((string *)&root_metadata);
  std::__cxx11::string::~string((string *)&raw_bytes);
  cVar1 = QPDFObjectHandle::isStream();
  if (cVar1 == '\0') {
    plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar6,"test 100 run on file with no metadata");
    __cxa_throw(plVar6,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  bVar2 = test_100::anon_class_1_0_00000001::operator()
                    ((anon_class_1_0_00000001 *)&w,(string *)&root_metadata,metadata);
  if (!bVar2) {
    __assert_fail("is_cleartext_in_file(raw_bytes, root_metadata)",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0xdc0,"void test_100(QPDF &, const char *)");
  }
  bVar2 = test_100::anon_class_1_0_00000001::operator()
                    ((anon_class_1_0_00000001 *)&root_metadata,(QPDFObjectHandle *)0x1,raw);
  if (!bVar2) {
    __assert_fail("is_cleartext(root_metadata, true)",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0xdc1,"void test_100(QPDF &, const char *)");
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&raw_bytes,"/Pages",(allocator<char> *)&o);
  QPDFObjectHandle::getKey((string *)&copied_root);
  std::__cxx11::string::string<std::allocator<char>>((string *)&page,"/Count",&local_121);
  QPDFObjectHandle::getKey((string *)&page_metadata);
  copied_page.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)QPDFObjectHandle::getIntValue();
  uVar3 = QIntC::IntConverter<long_long,_unsigned_long,_true,_false>::convert
                    ((longlong *)&copied_page);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&page_metadata.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)&page);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&copied_root.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)&raw_bytes);
  pvVar4 = (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)QPDF::getAllPages();
  p_Var5 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
           std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(pvVar4,uVar3 - 1);
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&page,p_Var5);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&raw_bytes,"/Metadata",(allocator<char> *)&copied_root);
  QPDFObjectHandle::getKey((string *)&page_metadata);
  std::__cxx11::string::~string((string *)&raw_bytes);
  cVar1 = QPDFObjectHandle::isStream();
  if (cVar1 == '\0') {
    plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar6,"test 100 run on file with no metadata on last page");
    __cxa_throw(plVar6,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  bVar2 = test_100::anon_class_1_0_00000001::operator()
                    ((anon_class_1_0_00000001 *)&w,(string *)&page_metadata,metadata_00);
  if (bVar2) {
    __assert_fail("!is_cleartext_in_file(raw_bytes, page_metadata)",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0xdc9,"void test_100(QPDF &, const char *)");
  }
  bVar2 = test_100::anon_class_1_0_00000001::operator()
                    ((anon_class_1_0_00000001 *)&page_metadata,(QPDFObjectHandle *)0x1,raw_00);
  if (bVar2) {
    __assert_fail("!is_cleartext(page_metadata, true)",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0xdca,"void test_100(QPDF &, const char *)");
  }
  bVar2 = test_100::anon_class_1_0_00000001::operator()
                    ((anon_class_1_0_00000001 *)&page_metadata,(QPDFObjectHandle *)0x0,raw_01);
  if (!bVar2) {
    __assert_fail("is_cleartext(page_metadata, false)",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0xdcb,"void test_100(QPDF &, const char *)");
  }
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_38,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&root_metadata);
  QVar8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdf;
  QVar8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&copied_root;
  QPDF::copyForeignObject(QVar8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_48,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&page_metadata);
  QVar9.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdf;
  QVar9.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&copied_page;
  QPDF::copyForeignObject(QVar9);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  QPDF::getRoot();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&raw_bytes,"/CopiedRootMetadata",&local_121);
  QPDFObjectHandle::replaceKey((string *)&o,(QPDFObjectHandle *)&raw_bytes);
  std::__cxx11::string::~string((string *)&raw_bytes);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&o.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  QPDF::getRoot();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&raw_bytes,"/CopiedPageMetadata",&local_121);
  QPDFObjectHandle::replaceKey((string *)&o,(QPDFObjectHandle *)&raw_bytes);
  std::__cxx11::string::~string((string *)&raw_bytes);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&o.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  QPDFWriter::QPDFWriter((QPDFWriter *)&raw_bytes,pdf,"b.pdf");
  QPDFWriter::setR6EncryptionParameters
            ((char *)&raw_bytes,"",true,true,true,true,true,true,qpdf_r3p_low,false);
  QPDFWriter::write();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&raw_bytes._M_string_length);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&copied_page.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&copied_root.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&page_metadata.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&page.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&root_metadata.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&root.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&w);
  QPDF::~QPDF(&updated);
  QUtil::read_file_into_string_abi_cxx11_((char *)&raw_bytes);
  QPDF::QPDF(&updated);
  QPDF::processFile((char *)&updated,"b.pdf");
  QPDF::getRoot();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&w,"/Metadata",(allocator<char> *)&page);
  QPDFObjectHandle::getKey((string *)&root_metadata);
  std::__cxx11::string::~string((string *)&w);
  std::__cxx11::string::string<std::allocator<char>>((string *)&w,"/Pages",(allocator<char> *)&o);
  QPDFObjectHandle::getKey((string *)&copied_root);
  std::__cxx11::string::string<std::allocator<char>>((string *)&page,"/Count",&local_121);
  QPDFObjectHandle::getKey((string *)&page_metadata);
  copied_page.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)QPDFObjectHandle::getIntValue();
  uVar3 = QIntC::IntConverter<long_long,_unsigned_long,_true,_false>::convert
                    ((longlong *)&copied_page);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&page_metadata.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)&page);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&copied_root.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)&w);
  pvVar4 = (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)QPDF::getAllPages();
  p_Var5 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
           std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(pvVar4,uVar3 - 1);
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&page,p_Var5);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&w,"/Metadata",(allocator<char> *)&copied_root);
  QPDFObjectHandle::getKey((string *)&page_metadata);
  std::__cxx11::string::~string((string *)&w);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&w,"/CopiedRootMetadata",(allocator<char> *)&copied_page);
  QPDFObjectHandle::getKey((string *)&copied_root);
  std::__cxx11::string::~string((string *)&w);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&w,"/CopiedPageMetadata",(allocator<char> *)&o);
  QPDFObjectHandle::getKey((string *)&copied_page);
  std::__cxx11::string::~string((string *)&w);
  bVar2 = test_100::anon_class_1_0_00000001::operator()
                    ((anon_class_1_0_00000001 *)&raw_bytes,(string *)&root_metadata,metadata_01);
  if (bVar2) {
    bVar2 = test_100::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)&root_metadata,(QPDFObjectHandle *)0x1,raw_02);
    if (!bVar2) {
      __assert_fail("is_cleartext(root_metadata, true)",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                    ,0xde3,"void test_100(QPDF &, const char *)");
    }
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&w,
               (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&page_metadata);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_98,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&copied_root);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_88,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&copied_page);
    lVar7 = 0;
    while( true ) {
      if (lVar7 == 0x30) {
        lVar7 = 0x28;
        do {
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(&w + lVar7));
          lVar7 = lVar7 + -0x10;
        } while (lVar7 != -8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&copied_page.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&copied_root.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&page_metadata.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&page.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&root_metadata.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&root.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        QPDF::~QPDF(&updated);
        std::__cxx11::string::~string((string *)&raw_bytes);
        return;
      }
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&o,
                 (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)(&w + lVar7));
      bVar2 = test_100::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)&raw_bytes,(string *)&o,metadata_02);
      if (bVar2) {
        __assert_fail("!is_cleartext_in_file(raw_bytes, o)",
                      "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                      ,0xde6,"void test_100(QPDF &, const char *)");
      }
      bVar2 = test_100::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)&o,(QPDFObjectHandle *)0x1,raw_03);
      if (bVar2) {
        __assert_fail("!is_cleartext(o, true)",
                      "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                      ,0xde7,"void test_100(QPDF &, const char *)");
      }
      bVar2 = test_100::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)&o,(QPDFObjectHandle *)0x0,raw_04);
      if (!bVar2) break;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&o.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      lVar7 = lVar7 + 0x10;
    }
    __assert_fail("is_cleartext(o, false)",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0xde8,"void test_100(QPDF &, const char *)");
  }
  __assert_fail("is_cleartext_in_file(raw_bytes, root_metadata)",
                "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc",
                0xde2,"void test_100(QPDF &, const char *)");
}

Assistant:

static void
test_100(QPDF& pdf, char const* arg2)
{
    // Designed for compressed-metadata.pdf
    auto is_cleartext = [](QPDFObjectHandle& metadata, bool raw) {
        std::string buf;
        Pl_String bufpl("buffer", nullptr, buf);
        metadata.pipeStreamData(&bufpl, 0, raw ? qpdf_dl_none : qpdf_dl_generalized);
        return buf.substr(0, 9) == "<?xpacket";
    };
    auto is_cleartext_in_file = [](std::string const& raw_bytes,
                                   QPDFObjectHandle& metadata) -> bool {
        auto buf = metadata.getRawStreamData();
        auto offset = metadata.getParsedOffset();
        auto from_file = raw_bytes.substr(QIntC::to_size(offset), 10);
        assert(buf->getSize() > 10);
        auto from_buf = std::string(reinterpret_cast<char*>(buf->getBuffer()), from_file.size());
        return from_buf == from_file;
    };

    {
        QPDFWriter w(pdf, "a.pdf");
        w.setR6EncryptionParameters(
            "", "", true, true, true, true, true, true, qpdf_r3p_full, false);
        w.write();
    }
    {
        QPDF encrypted;
        encrypted.processFile("a.pdf");
        auto raw_bytes = QUtil::read_file_into_string("a.pdf");
        auto root = encrypted.getRoot();
        auto root_metadata = root.getKey("/Metadata");
        if (!root_metadata.isStream()) {
            throw std::logic_error("test 100 run on file with no metadata");
        }
        assert(is_cleartext_in_file(raw_bytes, root_metadata));
        assert(is_cleartext(root_metadata, true));
        auto n_pages = QIntC::to_size(root.getKey("/Pages").getKey("/Count").getIntValue());
        auto page = encrypted.getAllPages().at(n_pages - 1);
        auto page_metadata = page.getKey("/Metadata");
        if (!page_metadata.isStream()) {
            throw std::logic_error("test 100 run on file with no metadata on last page");
        }
        // It's encrypted in the file, but you can recover the data, so it is properly decrypted.
        assert(!is_cleartext_in_file(raw_bytes, page_metadata));
        assert(!is_cleartext(page_metadata, true));
        assert(is_cleartext(page_metadata, false));

        // Now copy these metadata objects to the file and write it out again.
        auto copied_root_metadata = pdf.copyForeignObject(root_metadata);
        auto copied_page_metadata = pdf.copyForeignObject(page_metadata);
        pdf.getRoot().replaceKey("/CopiedRootMetadata", copied_root_metadata);
        pdf.getRoot().replaceKey("/CopiedPageMetadata", copied_root_metadata);
        QPDFWriter w(pdf, "b.pdf");
        w.setR6EncryptionParameters(
            "", "", true, true, true, true, true, true, qpdf_r3p_full, false);
        w.write();
    }
    auto raw_bytes = QUtil::read_file_into_string("b.pdf");
    QPDF updated;
    updated.processFile("b.pdf");
    auto root = updated.getRoot();
    auto root_metadata = root.getKey("/Metadata");
    auto n_pages = QIntC::to_size(root.getKey("/Pages").getKey("/Count").getIntValue());
    auto page = updated.getAllPages().at(n_pages - 1);
    auto page_metadata = page.getKey("/Metadata");
    auto copied_root = root.getKey("/CopiedRootMetadata");
    auto copied_page = root.getKey("/CopiedPageMetadata");
    // The ultimate root is still clear-text in file
    assert(is_cleartext_in_file(raw_bytes, root_metadata));
    assert(is_cleartext(root_metadata, true));
    // Everything else is compressed and encrypted in the file (not handled as special case).
    for (auto o: {page_metadata, copied_root, copied_page}) {
        assert(!is_cleartext_in_file(raw_bytes, o));
        assert(!is_cleartext(o, true));
        assert(is_cleartext(o, false));
    }
}